

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,void **vtt)

{
  void *pvVar1;
  
  TPZIntelGen<pzshape::TPZShapeQuad>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeQuad>,vtt + 1);
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)((long)(this->fSideOrient).fExtAlloc + *(long *)((long)pvVar1 + -0x60) + -0x70) = vtt[9]
  ;
  TPZVec<int>::TPZVec(&(this->fSideOrient).super_TPZVec<int>,0);
  (this->fSideOrient).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bdaf8;
  (this->fSideOrient).super_TPZVec<int>.fStore = (this->fSideOrient).fExtAlloc;
  (this->fSideOrient).super_TPZVec<int>.fNElements = 0;
  (this->fSideOrient).super_TPZVec<int>.fNAlloc = 0;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0188d9a8;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 5;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  (this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = -1;
  *(undefined4 *)(this->fConnectIndexes).fExtAlloc = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 1) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0xc) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 2) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x14) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 3) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x1c) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x24) = 0xffffffff;
  this->fhdivfam = ~EHDivStandard;
  *(undefined4 *)&this->field_0xe4 = 0xffffffff;
  *(undefined4 *)
   &this[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = 0xffffffff;
  *(undefined4 *)
   &this[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl.field_0x4 = 0xffffffff;
  *(undefined4 *)
   &this[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl.fMesh = 0xffffffff;
  *(undefined4 *)
   ((long)&this[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
           super_TPZInterpolationSpace.super_TPZCompEl.fMesh + 4) = 0xffffffff;
  this[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.super_TPZCompEl.fIndex = -1;
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv() :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>()
{
	this->fPreferredOrder = -1;
	int i;
	for(i=0;i<TSHAPE::NSides;i++) {
		this-> fConnectIndexes[i] = -1;
	}

}